

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_protocol.cpp
# Opt level: O3

int PackUserCmd(usercmd_t *ucmd,usercmd_t *basis,BYTE **stream)

{
  short sVar1;
  uint uVar2;
  byte *pbVar3;
  BYTE *pBVar4;
  byte *pbVar5;
  byte bVar6;
  short *psVar7;
  short *psVar8;
  short *psVar9;
  short *psVar10;
  short *psVar11;
  short *psVar12;
  uint uVar13;
  short local_44 [2];
  short local_40 [2];
  short local_3c [6];
  
  pbVar3 = *stream;
  if (basis == (usercmd_t *)0x0) {
    basis = (usercmd_t *)(local_3c + 4);
    local_3c[4] = 0;
    local_3c[5] = 0;
    psVar12 = local_3c;
    local_3c[0] = 0;
    psVar10 = local_3c + 3;
    local_3c[3] = 0;
    psVar11 = local_40;
    local_40[0] = 0;
    psVar9 = local_3c + 2;
    local_3c[2] = 0;
    psVar8 = local_44;
    local_44[0] = 0;
    psVar7 = local_3c + 1;
    local_3c[1] = 0;
  }
  else {
    psVar12 = &basis->pitch;
    psVar10 = &basis->yaw;
    psVar9 = &basis->forwardmove;
    psVar8 = &basis->sidemove;
    psVar7 = &basis->upmove;
    psVar11 = &basis->roll;
  }
  *pbVar3 = 0;
  pbVar5 = *stream + 1;
  *stream = pbVar5;
  uVar2 = ucmd->buttons;
  if (uVar2 == basis->buttons) {
    bVar6 = 0;
    goto LAB_00374c3b;
  }
  uVar13 = basis->buttons ^ uVar2;
  if (uVar13 < 0x80) {
    bVar6 = (byte)uVar2 & 0x7f;
  }
  else {
    *pbVar5 = (byte)uVar2 | 0x80;
    pBVar4 = *stream;
    *stream = pBVar4 + 1;
    pBVar4[1] = (0x3fff < uVar13) << 7 | (byte)(uVar2 >> 7) & 0x7f;
    pbVar5 = *stream + 1;
    *stream = pbVar5;
    bVar6 = 1;
    if (uVar13 < 0x4000) goto LAB_00374c3b;
    *pbVar5 = (0x1fffff < uVar13) << 7 | (byte)(uVar2 >> 0xe) & 0x7f;
    pbVar5 = *stream + 1;
    *stream = pbVar5;
    if (uVar13 < 0x200000) goto LAB_00374c3b;
    bVar6 = (byte)(uVar2 >> 0x15);
  }
  *pbVar5 = bVar6;
  pbVar5 = *stream + 1;
  *stream = pbVar5;
  bVar6 = 1;
LAB_00374c3b:
  sVar1 = ucmd->pitch;
  if (sVar1 != *psVar12) {
    bVar6 = bVar6 | 2;
    *pbVar5 = (byte)((ushort)sVar1 >> 8);
    (*stream)[1] = (BYTE)sVar1;
    pbVar5 = *stream + 2;
    *stream = pbVar5;
  }
  sVar1 = ucmd->yaw;
  if (sVar1 != *psVar10) {
    bVar6 = bVar6 | 4;
    *pbVar5 = (byte)((ushort)sVar1 >> 8);
    (*stream)[1] = (BYTE)sVar1;
    pbVar5 = *stream + 2;
    *stream = pbVar5;
  }
  sVar1 = ucmd->forwardmove;
  if (sVar1 != *psVar9) {
    bVar6 = bVar6 | 8;
    *pbVar5 = (byte)((ushort)sVar1 >> 8);
    (*stream)[1] = (BYTE)sVar1;
    pbVar5 = *stream + 2;
    *stream = pbVar5;
  }
  sVar1 = ucmd->sidemove;
  if (sVar1 != *psVar8) {
    bVar6 = bVar6 | 0x10;
    *pbVar5 = (byte)((ushort)sVar1 >> 8);
    (*stream)[1] = (BYTE)sVar1;
    pbVar5 = *stream + 2;
    *stream = pbVar5;
  }
  sVar1 = ucmd->upmove;
  if (sVar1 != *psVar7) {
    bVar6 = bVar6 | 0x20;
    *pbVar5 = (byte)((ushort)sVar1 >> 8);
    (*stream)[1] = (BYTE)sVar1;
    pbVar5 = *stream + 2;
    *stream = pbVar5;
  }
  sVar1 = ucmd->roll;
  if (sVar1 != *psVar11) {
    bVar6 = bVar6 | 0x40;
    *pbVar5 = (byte)((ushort)sVar1 >> 8);
    (*stream)[1] = (BYTE)sVar1;
    *stream = *stream + 2;
  }
  *pbVar3 = bVar6;
  return *(int *)stream - (int)pbVar3;
}

Assistant:

int PackUserCmd (const usercmd_t *ucmd, const usercmd_t *basis, BYTE **stream)
{
	BYTE flags = 0;
	BYTE *temp = *stream;
	BYTE *start = *stream;
	usercmd_t blank;
	DWORD buttons_changed;

	if (basis == NULL)
	{
		memset (&blank, 0, sizeof(blank));
		basis = &blank;
	}

	WriteByte (0, stream);			// Make room for the packing bits

	buttons_changed = ucmd->buttons ^ basis->buttons;
	if (buttons_changed != 0)
	{
		BYTE bytes[4] = {  BYTE(ucmd->buttons        & 0x7F),
						  BYTE((ucmd->buttons >> 7)  & 0x7F),
						  BYTE((ucmd->buttons >> 14) & 0x7F),
						  BYTE((ucmd->buttons >> 21) & 0xFF) };

		flags |= UCMDF_BUTTONS;

		if (buttons_changed & 0xFFFFFF80)
		{
			bytes[0] |= 0x80;
			if (buttons_changed & 0xFFFFC000)
			{
				bytes[1] |= 0x80;
				if (buttons_changed & 0xFFE00000)
				{
					bytes[2] |= 0x80;
				}
			}
		}
		WriteByte (bytes[0], stream);
		if (bytes[0] & 0x80)
		{
			WriteByte (bytes[1], stream);
			if (bytes[1] & 0x80)
			{
				WriteByte (bytes[2], stream);
				if (bytes[2] & 0x80)
				{
					WriteByte (bytes[3], stream);
				}
			}
		}
	}
	if (ucmd->pitch != basis->pitch)
	{
		flags |= UCMDF_PITCH;
		WriteWord (ucmd->pitch, stream);
	}
	if (ucmd->yaw != basis->yaw)
	{
		flags |= UCMDF_YAW;
		WriteWord (ucmd->yaw, stream);
	}
	if (ucmd->forwardmove != basis->forwardmove)
	{
		flags |= UCMDF_FORWARDMOVE;
		WriteWord (ucmd->forwardmove, stream);
	}
	if (ucmd->sidemove != basis->sidemove)
	{
		flags |= UCMDF_SIDEMOVE;
		WriteWord (ucmd->sidemove, stream);
	}
	if (ucmd->upmove != basis->upmove)
	{
		flags |= UCMDF_UPMOVE;
		WriteWord (ucmd->upmove, stream);
	}
	if (ucmd->roll != basis->roll)
	{
		flags |= UCMDF_ROLL;
		WriteWord (ucmd->roll, stream);
	}

	// Write the packing bits
	WriteByte (flags, &temp);

	return int(*stream - start);
}